

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
CustomHeaderOATC::CustomHeaderOATC
          (CustomHeaderOATC *this,vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_> *gens,
          ProgramContext *program)

{
  ushort uVar1;
  bool bVar2;
  reference ppCVar3;
  vector<CompiledData,_std::allocator<CompiledData>_> *this_00;
  unsigned_short *puVar4;
  size_type sVar5;
  unsigned_short local_8a;
  Command *local_88;
  undefined1 local_7c [12];
  CompiledCommand *ccmd;
  CompiledData *op;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CompiledData,_std::allocator<CompiledData>_> *__range2;
  CodeGenerator **pgen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_> *__range1;
  ProgramContext *program_local;
  vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_> *gens_local;
  CustomHeaderOATC *this_local;
  
  std::
  vector<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
  ::vector(&this->ordinal_commands);
  this->starting_opcode = 0x1000;
  __end1 = std::vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>::begin(gens);
  pgen = (CodeGenerator **)std::vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>::end(gens)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<CodeGenerator_*const_*,_std::vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>_>
                                     *)&pgen), bVar2) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<CodeGenerator_*const_*,_std::vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = CodeGenerator::ir(*ppCVar3);
    __end2 = std::vector<CompiledData,_std::allocator<CompiledData>_>::begin(this_00);
    op = (CompiledData *)std::vector<CompiledData,_std::allocator<CompiledData>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_CompiledData_*,_std::vector<CompiledData,_std::allocator<CompiledData>_>_>
                                       *)&op), bVar2) {
      ccmd = (CompiledCommand *)
             __gnu_cxx::
             __normal_iterator<const_CompiledData_*,_std::vector<CompiledData,_std::allocator<CompiledData>_>_>
             ::operator*(&__end2);
      bVar2 = is<CompiledCommand,eggs::variants::variant<CompiledLabelDef,CompiledCommand,CompiledHex>>
                        ((variant<CompiledLabelDef,_CompiledCommand,_CompiledHex> *)ccmd);
      if (bVar2) {
        local_7c._4_8_ =
             eggs::variants::get<CompiledCommand,CompiledLabelDef,CompiledCommand,CompiledHex,1ul>
                       ((variant<CompiledLabelDef,_CompiledCommand,_CompiledHex> *)ccmd);
        bVar2 = std::experimental::optional::operator_cast_to_bool
                          ((optional *)&((CompiledCommand *)local_7c._4_8_)->command->hash);
        if (bVar2) {
          find_opcode((CustomHeaderOATC *)local_7c,(Command *)this);
          bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)local_7c);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            local_88 = *(Command **)(local_7c._4_8_ + 8);
            sVar5 = std::
                    vector<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                    ::size(&this->ordinal_commands);
            local_8a = (unsigned_short)sVar5;
            std::
            vector<std::pair<Command_const*,unsigned_short>,std::allocator<std::pair<Command_const*,unsigned_short>>>
            ::emplace_back<Command_const*,unsigned_short>
                      ((vector<std::pair<Command_const*,unsigned_short>,std::allocator<std::pair<Command_const*,unsigned_short>>>
                        *)&this->ordinal_commands,&local_88,&local_8a);
          }
        }
        else {
          bVar2 = std::experimental::optional::operator_cast_to_bool
                            ((optional *)&(*(Command **)(local_7c._4_8_ + 8))->id);
          if ((bVar2) &&
             (uVar1 = this->starting_opcode,
             puVar4 = std::experimental::optional<unsigned_short>::operator*
                                (&(*(Command **)(local_7c._4_8_ + 8))->id), uVar1 < *puVar4)) {
            puVar4 = std::experimental::optional<unsigned_short>::operator*
                               (&(*(Command **)(local_7c._4_8_ + 8))->id);
            this->starting_opcode = *puVar4 + 1;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_CompiledData_*,_std::vector<CompiledData,_std::allocator<CompiledData>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<CodeGenerator_*const_*,_std::vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>_>
    ::operator++(&__end1);
  }
  if (this->starting_opcode < 0x7fff) {
    sVar5 = std::
            vector<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
            ::size(&this->ordinal_commands);
    if (sVar5 < 0x7fff - this->starting_opcode) {
      return;
    }
    ProgramContext::fatal_error<tag_nocontext_t>
              (program,(tag_nocontext_t *)&nocontext,"too many custom commands in a single script");
  }
  ProgramContext::fatal_error<tag_nocontext_t>
            (program,(tag_nocontext_t *)&nocontext,"failed to determine OATC starting opcode");
}

Assistant:

CustomHeaderOATC::CustomHeaderOATC(const std::vector<CodeGenerator*>& gens, ProgramContext& program)
{
    this->starting_opcode = 0x1000;

    for(auto& pgen : gens)
    {
        for(auto& op : pgen->ir())
        {
            if(is<CompiledCommand>(op.data))
            {
                auto& ccmd = get<CompiledCommand>(op.data);
                if(ccmd.command.hash)
                {
                    if(!this->find_opcode(ccmd.command))
                    {
                        this->ordinal_commands.emplace_back(&ccmd.command, (uint16_t) this->ordinal_commands.size());
                    }
                }
                else if(ccmd.command.id && this->starting_opcode < *ccmd.command.id)
                {
                    this->starting_opcode = *ccmd.command.id + 1;
                }
            }
        }
    }

    if(this->starting_opcode >= 0x7FFF)
        program.fatal_error(nocontext, "failed to determine OATC starting opcode");

    if(this->ordinal_commands.size() >= (0x7FFFu - this->starting_opcode))
        program.fatal_error(nocontext, "too many custom commands in a single script");
}